

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fuzzing.cpp
# Opt level: O1

void __thiscall wasm::TranslateToFuzzReader::finalizeTable(TranslateToFuzzReader *this)

{
  long lVar1;
  ulong uVar2;
  pointer ppGVar3;
  long *plVar4;
  long *plVar5;
  uint32_t uVar6;
  long lVar7;
  Const *pCVar8;
  undefined8 uVar9;
  pointer ppGVar10;
  ulong uVar11;
  long *plVar12;
  long *plVar13;
  long *plVar14;
  Name NVar15;
  Literal local_98;
  Builder *local_80;
  long *local_78;
  Random *local_70;
  FindAll<wasm::GlobalGet> local_68;
  long *local_50;
  long local_48;
  long *local_40;
  TranslateToFuzzReader *local_38;
  
  plVar14 = *(long **)(this->wasm + 0xa8);
  local_78 = *(long **)(this->wasm + 0xb0);
  if (plVar14 != local_78) {
    local_80 = &this->builder;
    local_70 = &this->random;
    local_38 = this;
    do {
      lVar7 = *(long *)(*plVar14 + 8);
      if (lVar7 == 0) {
        __assert_fail("table.is() && \"Table name must not be null\"",
                      "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/ir/module-utils.h"
                      ,0x85,
                      "void wasm::ModuleUtils::iterTableSegments(Module &, Name, T) [T = (lambda at /workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/fuzzing/fuzzing.cpp:803:26)]"
                     );
      }
      plVar13 = *(long **)(local_38->wasm + 0x60);
      plVar12 = *(long **)(local_38->wasm + 0x68);
      plVar4 = plVar14;
      lVar1 = lVar7;
      plVar5 = plVar12;
      if (plVar13 != plVar12) {
        do {
          local_40 = plVar5;
          local_48 = lVar1;
          local_50 = plVar4;
          lVar1 = *plVar13;
          if (*(long *)(lVar1 + 0x20) == lVar7) {
            if (((byte)local_38->wasm[0x179] & 4) == 0) {
              FindAll<wasm::GlobalGet>::FindAll(&local_68,*(Expression **)(lVar1 + 0x28));
              ppGVar3 = local_68.list.
                        super__Vector_base<wasm::GlobalGet_*,_std::allocator<wasm::GlobalGet_*>_>.
                        _M_impl.super__Vector_impl_data._M_finish;
              for (ppGVar10 = local_68.list.
                              super__Vector_base<wasm::GlobalGet_*,_std::allocator<wasm::GlobalGet_*>_>
                              ._M_impl.super__Vector_impl_data._M_start; ppGVar10 != ppGVar3;
                  ppGVar10 = ppGVar10 + 1) {
                NVar15.super_IString.str._M_str =
                     (char *)((*ppGVar10)->name).super_IString.str._M_len;
                NVar15.super_IString.str._M_len = (size_t)local_38->wasm;
                lVar7 = wasm::Module::getGlobal(NVar15);
                if (*(long *)(lVar7 + 0x20) != 0) {
                  __assert_fail("!wasm.getGlobal(get->name)->imported()",
                                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/fuzzing/fuzzing.cpp"
                                ,0x32b,
                                "auto wasm::TranslateToFuzzReader::finalizeTable()::(anonymous class)::operator()(ElementSegment *) const"
                               );
                }
                Literal::makeFromInt32(&local_98,0,(Type)*(uintptr_t *)(*local_50 + 0x48));
                pCVar8 = Builder::makeConst(local_80,&local_98);
                *(Const **)(lVar1 + 0x28) = pCVar8;
                wasm::Literal::~Literal(&local_98);
              }
              lVar7 = local_48;
              plVar12 = local_40;
              plVar14 = local_50;
              if (local_68.list.
                  super__Vector_base<wasm::GlobalGet_*,_std::allocator<wasm::GlobalGet_*>_>._M_impl.
                  super__Vector_impl_data._M_start != (pointer)0x0) {
                operator_delete(local_68.list.
                                super__Vector_base<wasm::GlobalGet_*,_std::allocator<wasm::GlobalGet_*>_>
                                ._M_impl.super__Vector_impl_data._M_start,
                                (long)local_68.list.
                                      super__Vector_base<wasm::GlobalGet_*,_std::allocator<wasm::GlobalGet_*>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                (long)local_68.list.
                                      super__Vector_base<wasm::GlobalGet_*,_std::allocator<wasm::GlobalGet_*>_>
                                      ._M_impl.super__Vector_impl_data._M_start);
                lVar7 = local_48;
                plVar12 = local_40;
                plVar14 = local_50;
              }
            }
            uVar11 = *(long *)(lVar1 + 0x40) - *(long *)(lVar1 + 0x38) >> 3;
            if (**(char **)(lVar1 + 0x28) == '\x0e') {
              lVar7 = wasm::Literal::getInteger();
              uVar11 = uVar11 + lVar7;
              lVar7 = local_48;
              plVar12 = local_40;
            }
            uVar2 = *(ulong *)(*plVar14 + 0x38);
            if (uVar11 < uVar2) {
              uVar11 = uVar2;
            }
            *(ulong *)(*plVar14 + 0x38) = uVar11;
          }
          plVar13 = plVar13 + 1;
          plVar4 = local_50;
          lVar1 = local_48;
          plVar5 = local_40;
        } while (plVar13 != plVar12);
      }
      uVar11 = *(ulong *)(*plVar14 + 0x38);
      if (9999 < uVar11) {
        uVar11 = 10000;
      }
      *(ulong *)(*plVar14 + 0x38) = uVar11;
      uVar6 = Random::upTo(local_70,2);
      if (uVar6 == 0) {
        uVar9 = 0xffffffff;
      }
      else {
        uVar9 = *(undefined8 *)(*plVar14 + 0x38);
      }
      lVar7 = *plVar14;
      *(undefined8 *)(lVar7 + 0x40) = uVar9;
      if (local_38->preserveImportsAndExports == false) {
        *(undefined8 *)(lVar7 + 0x28) = 0;
        *(undefined8 *)(lVar7 + 0x30) = 0;
        lVar7 = *plVar14;
        *(undefined8 *)(lVar7 + 0x18) = 0;
        *(undefined8 *)(lVar7 + 0x20) = 0;
      }
      plVar14 = plVar14 + 1;
    } while (plVar14 != local_78);
  }
  return;
}

Assistant:

void TranslateToFuzzReader::finalizeTable() {
  for (auto& table : wasm.tables) {
    ModuleUtils::iterTableSegments(
      wasm, table->name, [&](ElementSegment* segment) {
        // If the offset contains a global that was imported (which is ok) but
        // no longer is (not ok unless GC is enabled), we may need to change
        // that.
        if (!wasm.features.hasGC()) {
          for ([[maybe_unused]] auto* get :
               FindAll<GlobalGet>(segment->offset).list) {
            // No imported globals should remain.
            assert(!wasm.getGlobal(get->name)->imported());
            // TODO: the segments must not overlap...
            segment->offset =
              builder.makeConst(Literal::makeFromInt32(0, table->addressType));
          }
        }
        Address maxOffset = segment->data.size();
        if (auto* offset = segment->offset->dynCast<Const>()) {
          maxOffset = maxOffset + offset->value.getInteger();
        }
        table->initial = std::max(table->initial, maxOffset);
      });

    // The code above raises table->initial to a size large enough to accomodate
    // all of its segments, with the intention of avoiding a trap during
    // startup. However a single segment of (say) size 4GB would have a table of
    // that size, which will use a lot of memory and execute very slowly, so we
    // prefer in the fuzzer to trap on such a thing. To achieve that, set a
    // reasonable limit for the maximum table size.
    //
    // This also avoids an issue that arises from table->initial being an
    // Address (64 bits) but Table::kMaxSize being an Index (32 bits), as a
    // result of which we need to clamp to Table::kMaxSize as well in order for
    // the module to validate (but since we are clamping to a smaller value,
    // there is no need).
    const Address ReasonableMaxTableSize = 10000;
    table->initial = std::min(table->initial, ReasonableMaxTableSize);
    assert(ReasonableMaxTableSize <= Table::kMaxSize);

    table->max = oneIn(2) ? Address(Table::kUnlimitedSize) : table->initial;

    if (!preserveImportsAndExports) {
      // Avoid an imported table (which the fuzz harness would need to handle).
      table->module = table->base = Name();
    }
  }
}